

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void runExperiment(cpu_set_t *cpuset,int numOfThreads,int repeat,bool useTraditional)

{
  pthread_t pVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  __start_routine *__start_routine;
  int iVar5;
  ulong uVar6;
  ostream *poVar7;
  long lVar8;
  void *__arg;
  size_t sVar9;
  cpu_set_t *__cpuset;
  long *plVar10;
  pthread_t *__newthread;
  undefined8 uStack_d0;
  undefined1 auStack_c8 [8];
  cpu_set_t *local_c0;
  __start_routine *local_b8;
  undefined1 *local_b0;
  long local_a8;
  ulong local_a0;
  long *local_98;
  ulong local_90;
  long *local_88;
  ulong local_80;
  long *local_78;
  int local_6c;
  int relaxedOffset;
  int i_1;
  long throughputRandomSum;
  long throughputInsertSum;
  long throughputDeleteSum;
  int local_48;
  int s;
  int rc;
  int i;
  _func_void_ptr_void_ptr *routine;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  byte local_19;
  int local_18;
  int iStack_14;
  bool useTraditional_local;
  int repeat_local;
  int numOfThreads_local;
  cpu_set_t *cpuset_local;
  
  __vla_expr0 = (unsigned_long)auStack_c8;
  __vla_expr1 = (unsigned_long)(uint)numOfThreads;
  local_b0 = auStack_c8 + -(__vla_expr1 * 8 + 0xf & 0xfffffffffffffff0);
  routine = (_func_void_ptr_void_ptr *)(ulong)(uint)numOfThreads;
  lVar8 = (long)local_b0 - ((long)routine * 4 + 0xfU & 0xfffffffffffffff0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)numOfThreads;
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  if ((long)numOfThreads == 0 || SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_a8 = lVar8;
  local_a0 = uVar6;
  local_19 = useTraditional;
  local_18 = repeat;
  iStack_14 = numOfThreads;
  _repeat_local = cpuset;
  *(undefined8 *)(lVar8 + -8) = 0x10303e;
  local_98 = (long *)operator_new__(uVar6);
  *local_98 = 0;
  plVar10 = local_98 + 1;
  sVar9 = local_a0 - 8;
  *(undefined8 *)(lVar8 + -8) = 0x103065;
  memset(plVar10,0,sVar9);
  throughputDelete = local_98;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)iStack_14;
  uVar6 = SUB168(auVar3 * ZEXT816(8),0);
  if ((long)iStack_14 == 0 || SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_90 = uVar6;
  *(undefined8 *)(lVar8 + -8) = 0x1030a8;
  local_88 = (long *)operator_new__(uVar6);
  *local_88 = 0;
  plVar10 = local_88 + 1;
  sVar9 = local_90 - 8;
  *(undefined8 *)(lVar8 + -8) = 0x1030cc;
  memset(plVar10,0,sVar9);
  throughputInsert = local_88;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)iStack_14;
  uVar6 = SUB168(auVar4 * ZEXT816(8),0);
  if ((long)iStack_14 == 0 || SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_80 = uVar6;
  *(undefined8 *)(lVar8 + -8) = 0x103109;
  local_78 = (long *)operator_new__(uVar6);
  *local_78 = 0;
  plVar10 = local_78 + 1;
  sVar9 = local_80 - 8;
  *(undefined8 *)(lVar8 + -8) = 0x10312a;
  memset(plVar10,0,sVar9);
  throughputRandom = local_78;
  if ((local_19 & 1) == 0) {
    local_b8 = RunCPQExperiment;
  }
  else {
    local_b8 = RunTraditionalPQExperiment;
  }
  _rc = local_b8;
  s = 0;
  while( true ) {
    __start_routine = _rc;
    if (iStack_14 <= s) {
      throughputInsertSum = 0;
      throughputRandomSum = 0;
      _relaxedOffset = 0;
      for (local_6c = 0; local_6c < iStack_14; local_6c = local_6c + 1) {
        pVar1 = *(pthread_t *)(local_b0 + (long)local_6c * 8);
        *(undefined8 *)(lVar8 + -8) = 0x1032a9;
        pthread_join(pVar1,(void **)0x0);
        throughputInsertSum = throughputDelete[local_6c] + throughputInsertSum;
        throughputRandomSum = throughputInsert[local_6c] + throughputRandomSum;
        _relaxedOffset = throughputRandom[local_6c] + _relaxedOffset;
      }
      iVar5 = 3;
      if ((local_19 & 1) != 0) {
        iVar5 = 0;
      }
      throughputByThread[iStack_14 + -1][iVar5] =
           throughputRandomSum / 5 + throughputByThread[iStack_14 + -1][iVar5];
      throughputByThread[iStack_14 + -1][iVar5 + 1] =
           throughputInsertSum / 5 + throughputByThread[iStack_14 + -1][iVar5 + 1];
      throughputByThread[iStack_14 + -1][iVar5 + 2] =
           _relaxedOffset / 5 + throughputByThread[iStack_14 + -1][iVar5 + 2];
      return;
    }
    *(int *)(local_a8 + (long)s * 4) = s;
    __newthread = (pthread_t *)(local_b0 + (long)s * 8);
    __arg = (void *)(local_a8 + (long)s * 4);
    *(undefined8 *)(lVar8 + -8) = 0x1031b4;
    local_48 = pthread_create(__newthread,(pthread_attr_t *)0x0,__start_routine,__arg);
    pVar1 = *(pthread_t *)(local_b0 + (long)s * 8);
    local_c0 = _repeat_local;
    __cpuset = (cpu_set_t *)(_repeat_local + s % 8);
    *(undefined8 *)(lVar8 + -8) = 0x1031fa;
    throughputDeleteSum._4_4_ = pthread_setaffinity_np(pVar1,0x80,__cpuset);
    if (throughputDeleteSum._4_4_ != 0) break;
    if (local_48 != 0) {
      *(undefined8 *)(lVar8 + -8) = 0x103236;
      poVar7 = std::operator<<((ostream *)&std::cout,"Error: thread wasn\'t created,");
      iVar5 = local_48;
      *(undefined8 *)(lVar8 + -8) = 0x103241;
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
      *(undefined8 *)(lVar8 + -8) = 0x103250;
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      *(undefined8 *)(lVar8 + -8) = 0x10325a;
      exit(-1);
    }
    s = s + 1;
    throughputDeleteSum._4_4_ = 0;
  }
  uVar6 = (ulong)(uint)s;
  *(undefined8 *)(lVar8 + -8) = 0x103214;
  printf("Thread %d affinities was not set",uVar6);
  *(undefined8 *)(lVar8 + -8) = 0x10321d;
  pthread_exit((void *)0x0);
}

Assistant:

void runExperiment(const cpu_set_t *cpuset, int numOfThreads, int repeat, bool useTraditional) {
    pthread_t threads[numOfThreads];
    struct threadData td[numOfThreads];
    throughputDelete = new long[numOfThreads]{0};
    throughputInsert = new long[numOfThreads]{0};
    throughputRandom = new long[numOfThreads]{0};
    void *(*routine)(void *) = useTraditional ? RunTraditionalPQExperiment : RunCPQExperiment;

    for (int i = 0; i < numOfThreads; i++) {
        td[i].threadId = i;

        int rc = pthread_create(&threads[i], nullptr, routine, (void *) &td[i]);

        int s = pthread_setaffinity_np(threads[i], sizeof(cpu_set_t), &cpuset[i % CORES]);
        if (s != 0) {
            printf("Thread %d affinities was not set", i);
            pthread_exit(nullptr);
        }

        if (rc) {
            cout << "Error: thread wasn't created," << rc << endl;
            exit(-1);
        }
    }

    long throughputDeleteSum = 0;
    long throughputInsertSum = 0;
    long throughputRandomSum = 0;

    for (int i = 0; i < numOfThreads; i++) {
        pthread_join(threads[i], nullptr);

        throughputDeleteSum += throughputDelete[i];
        throughputInsertSum += throughputInsert[i];
        throughputRandomSum += throughputRandom[i];
    }

//    cout << "SUM " << (useTraditional ? "TRADITIONAL" : "RELAXED") << " THROUGHPUT PUSH: " << throughputInsertSum
//         << endl;
//    cout << "SUM " << (useTraditional ? "TRADITIONAL" : "RELAXED") << " THROUGHPUT POP: " << throughputDeleteSum
//         << endl;
//    cout << "SUM " << (useTraditional ? "TRADITIONAL" : "RELAXED") << " THROUGHPUT RANDOM: " << throughputRandomSum
//         << endl;

    int relaxedOffset = useTraditional ? 0 : 3;
    throughputByThread[numOfThreads - 1][relaxedOffset] += throughputInsertSum / REPEATS;
    throughputByThread[numOfThreads - 1][relaxedOffset + 1] += throughputDeleteSum / REPEATS;
    throughputByThread[numOfThreads - 1][relaxedOffset + 2] += throughputRandomSum / REPEATS;

//    delete throughputDelete;
//    delete throughputInsert;
//    delete throughputRandom;
}